

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaImpl::ArenaImpl<google::protobuf::ArenaOptions>
          (ArenaImpl *this,ArenaOptions *options)

{
  ulong uVar1;
  LogMessage *pLVar2;
  Block *pBVar3;
  LogMessage local_58;
  LogFinisher local_19;
  
  Options::Options<google::protobuf::ArenaOptions>(&this->options_,options);
  pBVar3 = (Block *)(this->options_).initial_block;
  if ((pBVar3 == (Block *)0x0) || (uVar1 = (this->options_).initial_block_size, uVar1 == 0)) {
    pBVar3 = (Block *)0x0;
  }
  else if (uVar1 < 0x18) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/arena_impl.h"
               ,0x59);
    pLVar2 = LogMessage::operator<<
                       (&local_58,"CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): "
                       );
    pLVar2 = LogMessage::operator<<(pLVar2,": Initial block size too small for header.");
    LogFinisher::operator=(&local_19,pLVar2);
    LogMessage::~LogMessage(&local_58);
    pBVar3 = (Block *)(this->options_).initial_block;
  }
  this->initial_block_ = pBVar3;
  Init(this);
  return;
}

Assistant:

explicit ArenaImpl(const O& options) : options_(options) {
    if (options_.initial_block != NULL && options_.initial_block_size > 0) {
      GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
          << ": Initial block size too small for header.";
      initial_block_ = reinterpret_cast<Block*>(options_.initial_block);
    } else {
      initial_block_ = NULL;
    }

    Init();
  }